

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O2

IterateResult __thiscall glcts::ViewportArray::DrawTestBase::iterate(DrawTestBase *this)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  deUint32 dVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  TestError *this_00;
  byte bVar8;
  socklen_t __len;
  texture *ptVar9;
  sockaddr *__addr;
  sockaddr *__addr_00;
  char *description;
  DrawTestBase *this_01;
  framebuffer *pfVar10;
  pointer_____offset_0x10___ *ppuVar11;
  GLuint draw_call;
  bool is_clear;
  uint local_310;
  uint local_30c;
  uint local_308;
  uint local_304;
  uint local_300;
  GLfloat depth_value;
  framebuffer framebuffer;
  vertexArray vao;
  GLchar *vert_template;
  GLchar *geom_template;
  texture texture_1;
  program program;
  string vertex;
  string geometry;
  string fragment;
  GLchar *frag_template;
  string local_218;
  GLchar *local_1f8 [4];
  GLchar *local_1d8 [4];
  texture texture_0;
  long lVar7;
  
  if ((this->super_TestCaseBase).m_is_viewport_array_supported == false) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_00,"Viewport array functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
               ,0x9dd);
    ppuVar11 = &tcu::NotSupportedError::typeinfo;
  }
  else {
    iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar7 = CONCAT44(extraout_var,iVar1);
    local_304 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    uVar2 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[10])(this);
    uVar3 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[7])(this);
    if (uVar2 < 4) {
      local_300 = *(uint *)(&DAT_017d5b60 + (ulong)uVar2 * 4);
      (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[8])(local_1d8,this);
      this_01 = this;
      (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[9])(local_1f8);
      getVertexShader_abi_cxx11_(&local_218,this_01);
      frag_template = local_1d8[0];
      geom_template = local_1f8[0];
      vert_template = local_218._M_dataplus._M_p;
      TestCaseBase::specializeShader_abi_cxx11_
                (&fragment,&this->super_TestCaseBase,1,&frag_template);
      TestCaseBase::specializeShader_abi_cxx11_
                (&geometry,&this->super_TestCaseBase,1,&geom_template);
      TestCaseBase::specializeShader_abi_cxx11_(&vertex,&this->super_TestCaseBase,1,&vert_template);
      program.m_context = (this->super_TestCaseBase).m_context;
      program.m_tesselation_control_shader_id = 0;
      program.m_tesselation_evaluation_shader_id = 0;
      program.m_vertex_shader_id = 0;
      program.m_compute_shader_id = 0;
      program.m_fragment_shader_id = 0;
      program.m_geometry_shader_id = 0;
      program.m_program_object_id = 0;
      iVar1 = 0;
      Utils::program::build
                (&program,(GLchar *)0x0,fragment._M_dataplus._M_p,geometry._M_dataplus._M_p,
                 (GLchar *)0x0,(GLchar *)0x0,vertex._M_dataplus._M_p,(GLchar **)0x0,0,false);
      __len = (socklen_t)geometry._M_dataplus._M_p;
      Utils::program::use(&program);
      vao.m_context = (this->super_TestCaseBase).m_context;
      vao.m_id = 0;
      Utils::vertexArray::generate(&vao);
      iVar1 = Utils::vertexArray::bind(&vao,iVar1,__addr,__len);
      local_304 = local_304 & 0x300;
      local_310 = (uint)CONCAT71((uint7)(uint3)((uint)iVar1 >> 8),1);
      uVar6 = 0;
      local_30c = uVar2;
      do {
        if (uVar6 == local_300) {
LAB_00d8b3eb:
          description = "Fail";
          if ((local_310 & 1) != 0) {
            description = "Pass";
          }
          tcu::TestContext::setTestResult
                    (((this->super_TestCaseBase).m_context)->m_testCtx,
                     (byte)~(byte)local_310 & QP_TEST_RESULT_FAIL,description);
LAB_00d8b41a:
          Utils::vertexArray::~vertexArray(&vao);
          Utils::program::~program(&program);
          std::__cxx11::string::~string((string *)&vertex);
          std::__cxx11::string::~string((string *)&geometry);
          std::__cxx11::string::~string((string *)&fragment);
          std::__cxx11::string::~string((string *)&local_218);
          std::__cxx11::string::~string((string *)local_1f8);
          std::__cxx11::string::~string((string *)local_1d8);
          return STOP;
        }
        texture_1.m_context = (this->super_TestCaseBase).m_context;
        texture_0.m_id = 0;
        texture_0.m_width = 0;
        texture_0.m_height = 0;
        texture_0.m_depth = 0;
        texture_0.m_is_array = false;
        texture_1.m_id = 0;
        texture_1.m_width = 0;
        texture_1.m_height = 0;
        texture_1.m_depth = 0;
        texture_1.m_is_array = false;
        local_308 = uVar6;
        texture_0.m_context = texture_1.m_context;
        (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xc])
                  (this,&texture_0,&texture_1);
        framebuffer.m_context = (this->super_TestCaseBase).m_context;
        framebuffer.m_id = 0;
        Utils::framebuffer::generate(&framebuffer);
        pfVar10 = &framebuffer;
        ptVar9 = &texture_1;
        (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xe])
                  (this,pfVar10,&texture_0);
        Utils::framebuffer::bind(&framebuffer,(int)pfVar10,__addr_00,(socklen_t)ptVar9);
        (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xf])
                  (this,(ulong)uVar2,(ulong)local_308);
        iVar1 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xb])
                          (this);
        if ((char)iVar1 == '\0') {
          uVar2 = 0;
          do {
            if (uVar3 == uVar2) {
              iVar1 = 0;
              uVar2 = local_30c;
              goto LAB_00d8b3ac;
            }
            (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xd])
                      (this,&program,(ulong)uVar2);
            (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[6])
                      (this,&is_clear,(ulong)uVar2,&depth_value);
            if (is_clear == true) {
              if (local_304 == 0x100) {
                (**(code **)(lVar7 + 0x1c8))(SUB84((double)depth_value,0));
              }
              else {
                (**(code **)(lVar7 + 0x1d0))();
              }
              dVar4 = (**(code **)(lVar7 + 0x800))();
              glu::checkError(dVar4,"ClearDepth",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                              ,0xa53);
              (**(code **)(lVar7 + 0x188))(0x100);
              dVar4 = (**(code **)(lVar7 + 0x800))();
              glu::checkError(dVar4,"Clear",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                              ,0xa56);
            }
            (**(code **)(lVar7 + 0x538))(0,0,1);
            dVar4 = (**(code **)(lVar7 + 0x800))();
            glu::checkError(dVar4,"DrawArrays",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                            ,0xa5a);
            iVar1 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[5])
                              (this,&texture_0,&texture_1);
            uVar2 = uVar2 + 1;
          } while ((char)iVar1 != '\0');
          local_310 = 0;
          iVar1 = 9;
          uVar2 = local_30c;
        }
        else {
          (**(code **)(lVar7 + 0x1c0))(0,0,0,0);
          dVar4 = (**(code **)(lVar7 + 0x800))();
          glu::checkError(dVar4,"ClearColor",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                          ,0xa68);
          (**(code **)(lVar7 + 0x188))(0x4000);
          dVar4 = (**(code **)(lVar7 + 0x800))();
          glu::checkError(dVar4,"Clear",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                          ,0xa6b);
          iVar5 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[5])
                            (this,&texture_0,&texture_1,0);
          bVar8 = (byte)iVar5 ^ 1;
          iVar1 = (uint)bVar8 + (uint)bVar8 * 8;
          local_310 = CONCAT31((int3)(local_310 >> 8),(byte)local_310 & (byte)iVar5);
        }
LAB_00d8b3ac:
        Utils::framebuffer::~framebuffer(&framebuffer);
        Utils::texture::~texture(&texture_1);
        Utils::texture::~texture(&texture_0);
        if (iVar1 != 0) {
          if (iVar1 != 9) goto LAB_00d8b41a;
          goto LAB_00d8b3eb;
        }
        uVar6 = local_308 + 1;
      } while( true );
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
               ,0x9f6);
    ppuVar11 = &tcu::TestError::typeinfo;
  }
  __cxa_throw(this_00,ppuVar11,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult DrawTestBase::iterate()
{
	if (!m_is_viewport_array_supported)
	{
		throw tcu::NotSupportedError(VIEWPORT_ARRAY_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	const glw::Functions&   gl			 = m_context.getRenderContext().getFunctions();
	const glu::ContextType& context_type = m_context.getRenderContext().getType();

	/* Test result */
	bool test_result = true;

	/* Get type of test */
	const TEST_TYPE test_type = getTestType();

	GLuint n_draw_calls = getDrawCallsNumber();
	GLuint n_iterations = 0;
	switch (test_type)
	{
	case VIEWPORT:
	case SCISSOR:
		n_iterations = 3;
		break;
	case DEPTHRANGE:
	case PROVOKING:
		n_iterations = 2;
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	/* Get shader sources and specialize them */
	const std::string& frag = getFragmentShader();
	const std::string& geom = getGeometryShader();
	const std::string& vert = getVertexShader();

	const GLchar* frag_template = frag.c_str();
	const GLchar* geom_template = geom.c_str();
	const GLchar* vert_template = vert.c_str();

	std::string fragment = specializeShader(1, &frag_template);
	std::string geometry = specializeShader(1, &geom_template);
	std::string vertex   = specializeShader(1, &vert_template);

	/* Prepare program */
	Utils::program program(m_context);

	try
	{
		program.build(0 /* compute */, fragment.c_str(), geometry.c_str(), 0 /* tess ctrl */, 0 /* tess eval */,
					  vertex.c_str(), 0 /* varying names */, 0 /* n_varyings */);
	}
	catch (Utils::shaderCompilationException& exc)
	{
		/* Something wrong with compilation, test case failed */
		tcu::MessageBuilder message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

		message << "Shader compilation failed. Error message: " << exc.m_error_message;

		Utils::program::printShaderSource(exc.m_shader_source.c_str(), message);

		message << tcu::TestLog::EndMessage;

		TCU_FAIL("Shader compilation failed");
	}
	catch (Utils::programLinkageException& exc)
	{
		/* Something wrong with linking, test case failed */
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Program linking failed. Error message: " << exc.m_error_message
											<< tcu::TestLog::EndMessage;
		TCU_FAIL("Program linking failed");
	}

	program.use();

	/* Prepare VAO */
	Utils::vertexArray vao(m_context);
	vao.generate();
	vao.bind();

	/* For each iteration from test type */
	for (GLuint i = 0; i < n_iterations; ++i)
	{
		/* Prepare textures */
		Utils::texture texture_0(m_context);
		Utils::texture texture_1(m_context);

		prepareTextures(texture_0, texture_1);

		/* Prepare framebuffer */
		Utils::framebuffer framebuffer(m_context);
		framebuffer.generate();
		setupFramebuffer(framebuffer, texture_0, texture_1);
		framebuffer.bind();

		/* Set up viewports */
		setupViewports(test_type, i);

		if (false == isClearTest())
		{
			/* For each draw call */
			for (GLuint draw_call = 0; draw_call < n_draw_calls; ++draw_call)
			{
				prepareUniforms(program, draw_call);

				bool	is_clear;
				GLfloat depth_value;

				getClearSettings(is_clear, draw_call, depth_value);

				if (true == is_clear)
				{
					if (glu::isContextTypeGLCore(context_type))
					{
						gl.clearDepth((GLdouble)depth_value);
					}
					else
					{
						gl.clearDepthf(depth_value);
					}
					GLU_EXPECT_NO_ERROR(gl.getError(), "ClearDepth");

					gl.clear(GL_DEPTH_BUFFER_BIT);
					GLU_EXPECT_NO_ERROR(gl.getError(), "Clear");
				}

				gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
				GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays");

				bool result = checkResults(texture_0, texture_1, draw_call);

				if (false == result)
				{
					test_result = false;
					goto end;
				}
			}
		}
		else
		{
			gl.clearColor(0.0f, 0.0f, 0.0f, 0.0f);
			GLU_EXPECT_NO_ERROR(gl.getError(), "ClearColor");

			gl.clear(GL_COLOR_BUFFER_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Clear");

			bool result = checkResults(texture_0, texture_1, 0);

			if (false == result)
			{
				test_result = false;
				goto end;
			}
		}
	}

end:
	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}